

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm.cpp
# Opt level: O2

int __thiscall
ncnn::Gemm::forward(Gemm *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
                   vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  Mat *pMVar1;
  size_t _elemsize;
  int *piVar2;
  pointer pMVar3;
  uint uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  float *pfVar17;
  int k;
  uint _w;
  ulong uVar18;
  void *pvVar19;
  ulong uVar20;
  int j;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  uint uVar24;
  void *pvVar25;
  long lVar26;
  bool bVar27;
  bool bVar28;
  float fVar29;
  ulong local_f0;
  Mat local_e8;
  Mat local_98;
  long local_48;
  long local_40;
  ulong local_38;
  
  pMVar1 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  _elemsize = pMVar1->elemsize;
  local_e8.cstep = 0;
  local_e8.data = (void *)0x0;
  local_e8.refcount._0_4_ = 0;
  local_e8.refcount._4_4_ = 0;
  local_e8.elemsize._0_4_ = 0;
  local_e8.elemsize._4_4_ = 0;
  local_e8.elempack = 0;
  local_e8.allocator = (Allocator *)0x0;
  local_e8.dims = 0;
  local_e8.w = 0;
  local_e8.h = 0;
  local_e8.d = 0;
  local_e8.c = 0;
  if (this->transA == 0) {
    if (&local_e8 != pMVar1) {
      piVar2 = pMVar1->refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      local_e8.data = pMVar1->data;
      local_e8.refcount._0_4_ = SUB84(pMVar1->refcount,0);
      local_e8.refcount._4_4_ = (undefined4)((ulong)pMVar1->refcount >> 0x20);
      local_e8.elemsize._0_4_ = (undefined4)pMVar1->elemsize;
      local_e8.elemsize._4_4_ = (undefined4)(pMVar1->elemsize >> 0x20);
      local_e8.elempack = pMVar1->elempack;
      local_e8.allocator = pMVar1->allocator;
      uVar5 = pMVar1->dims;
      uVar6 = pMVar1->w;
      uVar7 = pMVar1->h;
      uVar8 = pMVar1->d;
      local_e8.c = pMVar1->c;
      local_e8.cstep = pMVar1->cstep;
      local_e8.dims = uVar5;
      local_e8.w = uVar6;
      local_e8.h = uVar7;
      local_e8.d = uVar8;
    }
  }
  else {
    Mat::create(&local_e8,pMVar1->h,pMVar1->w,_elemsize,opt->workspace_allocator);
    uVar16 = 0;
    uVar18 = 0;
    if (0 < local_e8.w) {
      uVar18 = (ulong)(uint)local_e8.w;
    }
    uVar20 = (ulong)(uint)local_e8.h;
    pvVar19 = local_e8.data;
    if (local_e8.h < 1) {
      uVar20 = uVar16;
    }
    for (; uVar16 != uVar20; uVar16 = uVar16 + 1) {
      for (uVar23 = 0; uVar18 != uVar23; uVar23 = uVar23 + 1) {
        *(undefined4 *)((long)pvVar19 + uVar23 * 4) =
             *(undefined4 *)
              ((long)pMVar1->data + uVar16 * 4 + (long)pMVar1->w * uVar23 * pMVar1->elemsize);
      }
      pvVar19 = (void *)((long)pvVar19 +
                        (long)local_e8.w *
                        CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize));
    }
  }
  local_98.cstep = 0;
  local_98.data = (void *)0x0;
  local_98.refcount._0_4_ = 0;
  local_98.refcount._4_4_ = 0;
  local_98.elemsize._0_4_ = 0;
  local_98.elemsize._4_4_ = 0;
  local_98.elempack = 0;
  local_98.allocator = (Allocator *)0x0;
  local_98.dims = 0;
  local_98.w = 0;
  local_98.h = 0;
  local_98.d = 0;
  local_98.c = 0;
  if (this->transB == 0) {
    Mat::create(&local_98,pMVar1[1].h,pMVar1[1].w,_elemsize,opt->workspace_allocator);
    uVar16 = 0;
    uVar18 = 0;
    if (0 < local_98.w) {
      uVar18 = (ulong)(uint)local_98.w;
    }
    uVar20 = 0;
    pvVar19 = local_98.data;
    if (0 < local_98.h) {
      uVar20 = (ulong)(uint)local_98.h;
    }
    for (; _w = local_98.h, uVar16 != uVar20; uVar16 = uVar16 + 1) {
      for (uVar23 = 0; uVar18 != uVar23; uVar23 = uVar23 + 1) {
        *(undefined4 *)((long)pvVar19 + uVar23 * 4) =
             *(undefined4 *)
              ((long)pMVar1[1].data + uVar16 * 4 + (long)pMVar1[1].w * uVar23 * pMVar1[1].elemsize);
      }
      pvVar19 = (void *)((long)pvVar19 +
                        (long)local_98.w *
                        CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize));
    }
  }
  else if (&local_98 == pMVar1 + 1) {
    _w = 0;
  }
  else {
    piVar2 = pMVar1[1].refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    local_98.data = pMVar1[1].data;
    local_98.refcount._0_4_ = SUB84(pMVar1[1].refcount,0);
    local_98.refcount._4_4_ = (undefined4)((ulong)pMVar1[1].refcount >> 0x20);
    local_98.elemsize._0_4_ = (undefined4)pMVar1[1].elemsize;
    local_98.elemsize._4_4_ = (undefined4)(pMVar1[1].elemsize >> 0x20);
    local_98.elempack = pMVar1[1].elempack;
    local_98.allocator = pMVar1[1].allocator;
    uVar9 = pMVar1[1].dims;
    uVar10 = pMVar1[1].w;
    uVar11 = pMVar1[1].h;
    uVar12 = pMVar1[1].d;
    local_98.c = pMVar1[1].c;
    local_98.cstep = pMVar1[1].cstep;
    _w = pMVar1[1].h;
    local_98.dims = uVar9;
    local_98.w = uVar10;
    local_98.h = uVar11;
    local_98.d = uVar12;
  }
  iVar13 = local_e8.h;
  uVar4 = local_e8.w;
  pMVar3 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar26 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)pMVar3;
  if (lVar26 == 0xd8) {
    iVar14 = pMVar3[2].dims;
    uVar22 = pMVar3[2].w;
    bVar27 = uVar22 == _w;
    uVar15 = (uint)(uVar22 == local_e8.h && iVar14 == 1);
    uVar21 = uVar15;
    if (bVar27) {
      uVar21 = 4;
    }
    if (iVar14 != 1) {
      uVar21 = uVar15;
    }
    uVar15 = pMVar3[2].h;
    uVar24 = 2;
    if (uVar15 != local_e8.h) {
      uVar24 = uVar21;
    }
    if (uVar22 != 1) {
      uVar24 = uVar21;
    }
    bVar28 = iVar14 != 2;
    if (bVar28) {
      uVar24 = uVar21;
    }
    uVar22 = 3;
    if (uVar15 != local_e8.h) {
      uVar22 = uVar24;
    }
    if (bVar28 || !bVar27) {
      uVar22 = uVar24;
    }
    uVar21 = 4;
    if (uVar15 != 1) {
      uVar21 = uVar22;
    }
    if (bVar28 || !bVar27) {
      uVar21 = uVar22;
    }
    local_f0 = (ulong)uVar21;
  }
  else {
    local_f0 = 0;
  }
  pMVar1 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  Mat::create(pMVar1,_w,local_e8.h,_elemsize,opt->blob_allocator);
  pfVar17 = (float *)pMVar1->data;
  iVar14 = -100;
  if ((pfVar17 != (float *)0x0) && ((long)pMVar1->c * pMVar1->cstep != 0)) {
    if ((int)uVar4 < 1) {
      uVar4 = 0;
    }
    uVar16 = 0;
    if (0 < (int)_w) {
      uVar16 = (ulong)_w;
    }
    local_38 = (ulong)(uint)iVar13;
    if (iVar13 < 1) {
      local_38 = 0;
    }
    local_40 = (long)local_e8.w * CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize);
    local_48 = (long)(int)_w;
    pvVar19 = local_e8.data;
    for (uVar18 = 0; uVar18 != local_38; uVar18 = uVar18 + 1) {
      pvVar25 = local_98.data;
      for (uVar20 = 0; uVar20 != uVar16; uVar20 = uVar20 + 1) {
        fVar29 = 0.0;
        if (lVar26 == 0xd8) {
          iVar13 = (*(code *)(&DAT_004d0230 + *(int *)(&DAT_004d0230 + local_f0 * 4)))();
          return iVar13;
        }
        for (uVar23 = 0; uVar4 != uVar23; uVar23 = uVar23 + 1) {
          fVar29 = fVar29 + *(float *)((long)pvVar25 + uVar23 * 4) *
                            *(float *)((long)pvVar19 + uVar23 * 4);
        }
        *pfVar17 = fVar29 * this->alpha;
        pfVar17 = pfVar17 + 1;
        pvVar25 = (void *)((long)pvVar25 +
                          (long)local_98.w *
                          CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize));
      }
      pvVar19 = (void *)((long)pvVar19 + local_40);
    }
    iVar14 = 0;
  }
  piVar2 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (local_98.allocator == (Allocator *)0x0) {
        free(local_98.data);
      }
      else {
        (*(local_98.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar2 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (local_e8.allocator == (Allocator *)0x0) {
        free(local_e8.data);
      }
      else {
        (*(local_e8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar14;
}

Assistant:

int Gemm::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& A0 = bottom_blobs[0];
    const Mat& B0 = bottom_blobs[1];

    size_t elemsize = A0.elemsize;

    Mat A;
    if (transA == 0)
    {
        A = A0;
    }
    else
    {
        // transpose A to row-major
        A.create(A0.h, A0.w, elemsize, opt.workspace_allocator);

        for (int i = 0; i < A.h; i++)
        {
            float* ptr = A.row(i);
            for (int j = 0; j < A.w; j++)
            {
                ptr[j] = A0.row(j)[i];
            }
        }
    }

    Mat B;
    if (transB == 0)
    {
        // transpose B to col-major
        B.create(B0.h, B0.w, elemsize, opt.workspace_allocator);

        for (int i = 0; i < B.h; i++)
        {
            float* ptr = B.row(i);
            for (int j = 0; j < B.w; j++)
            {
                ptr[j] = B0.row(j)[i];
            }
        }
    }
    else
    {
        B = B0;
    }

    int M = A.h;
    int K = A.w; // assert A.w == B.w
    int N = B.h;

    bool has_C = bottom_blobs.size() == 3;

    const float* ptrC = 0;
    int broadcast_type_C = 0;
    if (has_C)
    {
        const Mat& C = bottom_blobs[2];

        ptrC = C;

        if (C.dims == 1 && C.w == 1)
        {
            // scalar
            broadcast_type_C = 0;
        }
        if (C.dims == 1 && C.w == M)
        {
            // M
            // auto broadcast from h to w is the ncnn-style convention
            broadcast_type_C = 1;
        }
        if (C.dims == 1 && C.w == N)
        {
            // N
            broadcast_type_C = 4;
        }
        if (C.dims == 2 && C.w == 1 && C.h == M)
        {
            // Mx1
            broadcast_type_C = 2;
        }
        if (C.dims == 2 && C.w == N && C.h == M)
        {
            // MxN
            broadcast_type_C = 3;
        }
        if (C.dims == 2 && C.w == N && C.h == 1)
        {
            // 1xN
            broadcast_type_C = 4;
        }
    }

    Mat& top_blob = top_blobs[0];
    top_blob.create(N, M, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    float* outptr = top_blob;
    for (int i = 0; i < M; i++)
    {
        const float* ptrA = A.row(i);

        for (int j = 0; j < N; j++)
        {
            const float* ptrB = B.row(j);

            float sum = 0.f;
            if (has_C)
            {
                if (broadcast_type_C == 0)
                {
                    sum = ptrC[0];
                }
                if (broadcast_type_C == 1)
                {
                    sum = ptrC[i];
                }
                if (broadcast_type_C == 2)
                {
                    sum = ptrC[i];
                }
                if (broadcast_type_C == 3)
                {
                    sum = ptrC[i * N + j];
                }
                if (broadcast_type_C == 4)
                {
                    sum = ptrC[j];
                }

                sum *= beta;
            }

            for (int k = 0; k < K; k++)
            {
                sum += ptrA[k] * ptrB[k];
            }

            *outptr++ = sum * alpha;
        }
    }

    return 0;
}